

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O2

void __thiscall AutoArgParse::FlagStore::parse(FlagStore *this,ArgIter *first,ArgIter *last)

{
  bool bVar1;
  MissingMandatoryArgException *this_00;
  UnexpectedArgException *pUVar2;
  int iVar3;
  pointer_____offset_0x10___ *ppuVar4;
  int iVar5;
  Policy foundPolicy;
  string local_70;
  string local_50;
  
  iVar5 = 0;
  iVar3 = 0;
  while (first->_M_current != last->_M_current) {
    bVar1 = tryParseFlag(this,first,last,&foundPolicy);
    if (bVar1) {
      iVar5 = iVar5 + (uint)(foundPolicy == MANDATORY);
    }
    else {
      bVar1 = tryParseArg(this,first,last,&foundPolicy);
      if (!bVar1) break;
      iVar3 = iVar3 + (uint)(foundPolicy == MANDATORY);
    }
  }
  if (iVar5 == this->_numberMandatoryFlags) {
    if (iVar3 == this->_numberMandatoryArgs) {
      return;
    }
    if (first->_M_current != last->_M_current) {
      pUVar2 = (UnexpectedArgException *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string((string *)&local_70,(string *)first->_M_current);
      UnexpectedArgException::UnexpectedArgException(pUVar2,&local_70,this);
      __cxa_throw(pUVar2,&UnexpectedArgException::typeinfo,
                  UnexpectedArgException::~UnexpectedArgException);
    }
    this_00 = (MissingMandatoryArgException *)__cxa_allocate_exception(0x38);
    MissingMandatoryArgException::MissingMandatoryArgException(this_00,this);
    ppuVar4 = &MissingMandatoryArgException::typeinfo;
  }
  else {
    if (first->_M_current != last->_M_current) {
      pUVar2 = (UnexpectedArgException *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string((string *)&local_50,(string *)first->_M_current);
      UnexpectedArgException::UnexpectedArgException(pUVar2,&local_50,this);
      __cxa_throw(pUVar2,&UnexpectedArgException::typeinfo,
                  UnexpectedArgException::~UnexpectedArgException);
    }
    this_00 = (MissingMandatoryArgException *)__cxa_allocate_exception(0x38);
    MissingMandatoryFlagException::MissingMandatoryFlagException
              ((MissingMandatoryFlagException *)this_00,this);
    ppuVar4 = &MissingMandatoryFlagException::typeinfo;
  }
  __cxa_throw(this_00,ppuVar4,ParseException::~ParseException);
}

Assistant:

AUTOARGPARSE_INLINE void FlagStore::parse(ArgIter& first, ArgIter& last) {
    int numberParsedMandatoryFlags = 0;
    int numberParsedMandatoryArgs = 0;
    while (first != last) {
        Policy foundPolicy;
        if (tryParseFlag(first, last, foundPolicy)) {
            if (foundPolicy == Policy::MANDATORY) {
                numberParsedMandatoryFlags++;
            }
        } else if (tryParseArg(first, last, foundPolicy)) {
            if (foundPolicy == Policy::MANDATORY) {
                numberParsedMandatoryArgs++;
            }
        } else {
            break;
        }
    }
    if (numberParsedMandatoryFlags != _numberMandatoryFlags) {
        if (first == last) {
            throw MissingMandatoryFlagException(*this);
        } else {
            throw UnexpectedArgException(*first, *this);
        }
    }
    if (numberParsedMandatoryArgs != _numberMandatoryArgs) {
        if (first == last) {
            throw MissingMandatoryArgException(*this);
        } else {
            throw UnexpectedArgException(*first, *this);
        }
    }
}